

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

BIGNUM * BN_dup(BIGNUM *a)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *t;
  undefined8 local_20;
  undefined8 local_8;
  
  if (a == (BIGNUM *)0x0) {
    local_8 = (BIGNUM *)0x0;
  }
  else {
    iVar1 = BN_get_flags((BIGNUM *)a,8);
    if (iVar1 == 0) {
      local_20 = (BIGNUM *)BN_new();
    }
    else {
      local_20 = BN_secure_new();
    }
    if (local_20 == (BIGNUM *)0x0) {
      local_8 = (BIGNUM *)0x0;
    }
    else {
      pBVar2 = BN_copy((BIGNUM *)local_20,a);
      if (pBVar2 == (BIGNUM *)0x0) {
        BN_free((BIGNUM *)local_20);
        local_8 = (BIGNUM *)0x0;
      }
      else {
        local_8 = (BIGNUM *)local_20;
      }
    }
  }
  return local_8;
}

Assistant:

BIGNUM *BN_dup(const BIGNUM *a)
{
    BIGNUM *t;

    if (a == NULL)
        return NULL;
    bn_check_top(a);

    t = BN_get_flags(a, BN_FLG_SECURE) ? BN_secure_new() : BN_new();
    if (t == NULL)
        return NULL;
    if (!BN_copy(t, a)) {
        BN_free(t);
        return NULL;
    }
    bn_check_top(t);
    return t;
}